

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cCullDistanceTests.cpp
# Opt level: O0

int __thiscall glcts::CullDistance::Tests::init(Tests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  APICoverageTest *this_00;
  FunctionalTest *this_01;
  NegativeTest *this_02;
  Tests *this_local;
  
  this_00 = (APICoverageTest *)operator_new(0xb0);
  APICoverageTest::APICoverageTest(this_00,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
  this_01 = (FunctionalTest *)operator_new(0xd0);
  CullDistance::FunctionalTest::FunctionalTest(this_01,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_01);
  this_02 = (NegativeTest *)operator_new(0x90);
  NegativeTest::NegativeTest(this_02,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_02);
  return extraout_EAX;
}

Assistant:

void CullDistance::Tests::init()
{
	addChild(new CullDistance::APICoverageTest(m_context));
	addChild(new CullDistance::FunctionalTest(m_context));
	addChild(new CullDistance::NegativeTest(m_context));
}